

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>>,std::tuple<mp::expr::Kind,BasicTestExpr<1>>>
               (tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>_>
                *matcher_tuple,tuple<mp::expr::Kind,_BasicTestExpr<1>_> *value_tuple)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>>,std::tuple<mp::expr::Kind,BasicTestExpr<1>>>
                    (matcher_tuple,value_tuple);
  if (bVar1) {
    bVar1 = MatcherBase<BasicTestExpr<1>_>::Matches
                      ((MatcherBase<BasicTestExpr<1>_> *)matcher_tuple,
                       (BasicTestExpr<1>)
                       (value_tuple->super__Tuple_impl<0UL,_mp::expr::Kind,_BasicTestExpr<1>_>).
                       super__Tuple_impl<1UL,_BasicTestExpr<1>_>.
                       super__Head_base<1UL,_BasicTestExpr<1>,_false>._M_head_impl.id_);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }